

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

multi_ex * CSOAA::process_labels(ldf *data,multi_ex *ec_seq_all)

{
  bool bVar1;
  const_reference ppeVar2;
  value_type *ppeVar3;
  value_type *ppeVar4;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  multi_ex *in_RDI;
  example *in_stack_00000018;
  ldf *in_stack_00000020;
  size_t j;
  size_t i;
  example *ec;
  multi_ex *ret;
  value_type *__x;
  multi_ex *this;
  example *in_stack_ffffffffffffffb8;
  value_type *local_30;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  value_type this_00;
  
  this = in_RDI;
  ppeVar2 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RDX,0);
  this_00 = *ppeVar2;
  bVar1 = ec_is_label_definition(in_stack_ffffffffffffffb8);
  if (bVar1) {
    process_label(in_stack_00000020,in_stack_00000018);
    std::vector<example_*,_std::allocator<example_*>_>::vector
              ((vector<example_*,_std::allocator<example_*>_> *)0x399666);
    local_30 = (value_type *)0x1;
    while (__x = local_30,
          ppeVar3 = (value_type *)std::vector<example_*,_std::allocator<example_*>_>::size(in_RDX),
          __x < ppeVar3) {
      std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RDX,(size_type)local_30);
      bVar1 = ec_is_label_definition(in_stack_ffffffffffffffb8);
      if (!bVar1) {
        while (ppeVar3 = local_30,
              ppeVar4 = (value_type *)
                        std::vector<example_*,_std::allocator<example_*>_>::size(in_RDX),
              local_30 < ppeVar4) {
          std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RDX,(size_type)ppeVar3);
          std::vector<example_*,_std::allocator<example_*>_>::push_back(this,__x);
          local_30 = (value_type *)((long)ppeVar3 + 1);
        }
        return in_RDI;
      }
      process_label(in_stack_00000020,in_stack_00000018);
      local_30 = (value_type *)((long)local_30 + 1);
    }
  }
  else {
    std::vector<example_*,_std::allocator<example_*>_>::vector
              ((vector<example_*,_std::allocator<example_*>_> *)this_00,
               (vector<example_*,_std::allocator<example_*>_> *)
               CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  }
  return in_RDI;
}

Assistant:

multi_ex process_labels(ldf& data, const multi_ex& ec_seq_all)
{
  example* ec = ec_seq_all[0];

  // check the first element, if it's not a label, return
  if (!ec_is_label_definition(*ec))
    return ec_seq_all;

  // process the first element as a label
  process_label(data, ec);

  multi_ex ret;
  size_t i = 1;
  // process the rest of the elements that are labels
  for (; i < ec_seq_all.size(); i++)
  {
    ec = ec_seq_all[i];
    if (!ec_is_label_definition(*ec))
    {
      for (size_t j = i; j < ec_seq_all.size(); j++) ret.push_back(ec_seq_all[j]);
      // return index of the first element that is not a label
      return ret;
    }

    process_label(data, ec);
  }

  // all examples were labels return size
  return ret;
}